

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handshake.cc
# Opt level: O2

bool __thiscall
bssl::ssl_parse_extensions
          (bssl *this,CBS *cbs,uint8_t *out_alert,initializer_list<bssl::SSLExtension_*> extensions,
          bool ignore_unknown)

{
  long lVar1;
  uint16_t *puVar2;
  size_t sVar3;
  undefined1 uVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  uint16_t type;
  CBS *local_60;
  CBS copy;
  CBS data;
  
  lVar7 = (long)extensions._M_array << 3;
  lVar6 = 0;
  while (lVar7 != lVar6) {
    lVar1 = *(long *)(out_alert + lVar6);
    *(undefined1 *)(lVar1 + 3) = 0;
    *(undefined8 *)(lVar1 + 8) = 0;
    *(undefined8 *)(lVar1 + 0x10) = 0;
    lVar6 = lVar6 + 8;
    if (*(char *)(lVar1 + 2) == '\0' && (char)extensions._M_len == '\x01') {
      __assert_fail("!ignore_unknown",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake.cc"
                    ,0xb5,
                    "bool bssl::ssl_parse_extensions(const CBS *, uint8_t *, std::initializer_list<SSLExtension *>, bool)"
                   );
    }
  }
  copy.data = *(uint8_t **)this;
  copy.len = *(size_t *)(this + 8);
  local_60 = cbs;
LAB_0013fbb3:
  do {
    sVar3 = copy.len;
    if (copy.len == 0) goto LAB_0013fc96;
    iVar5 = CBS_get_u16(&copy,&type);
    if (iVar5 == 0) {
LAB_0013fc1e:
      ERR_put_error(0x10,0,0xbe,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake.cc"
                    ,0xbf);
      uVar4 = 0x32;
      goto LAB_0013fc8f;
    }
    iVar5 = CBS_get_u16_length_prefixed(&copy,&data);
    if (iVar5 == 0) goto LAB_0013fc1e;
    for (lVar6 = 0; lVar7 != lVar6; lVar6 = lVar6 + 8) {
      puVar2 = *(uint16_t **)(out_alert + lVar6);
      if ((type == *puVar2) && ((char)puVar2[1] != '\0')) {
        if (*(char *)((long)puVar2 + 3) != '\x01') {
          *(undefined1 *)((long)puVar2 + 3) = 1;
          *(uint8_t **)(puVar2 + 4) = data.data;
          *(size_t *)(puVar2 + 8) = data.len;
          goto LAB_0013fbb3;
        }
        ERR_put_error(0x10,0,0x101,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake.cc"
                      ,0xd8);
        uVar4 = 0x2f;
        goto LAB_0013fc8f;
      }
    }
  } while ((char)extensions._M_len != '\0');
  ERR_put_error(0x10,0,0xde,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake.cc"
                ,0xd0);
  ERR_add_error_dataf("extension %u",(ulong)type);
  uVar4 = 0x6e;
LAB_0013fc8f:
  *(undefined1 *)&local_60->data = uVar4;
LAB_0013fc96:
  return sVar3 == 0;
}

Assistant:

bool ssl_parse_extensions(const CBS *cbs, uint8_t *out_alert,
                          std::initializer_list<SSLExtension *> extensions,
                          bool ignore_unknown) {
  // Reset everything.
  for (SSLExtension *ext : extensions) {
    ext->present = false;
    CBS_init(&ext->data, nullptr, 0);
    if (!ext->allowed) {
      assert(!ignore_unknown);
    }
  }

  CBS copy = *cbs;
  while (CBS_len(&copy) != 0) {
    uint16_t type;
    CBS data;
    if (!CBS_get_u16(&copy, &type) ||
        !CBS_get_u16_length_prefixed(&copy, &data)) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_PARSE_TLSEXT);
      *out_alert = SSL_AD_DECODE_ERROR;
      return false;
    }

    SSLExtension *found = nullptr;
    for (SSLExtension *ext : extensions) {
      if (type == ext->type && ext->allowed) {
        found = ext;
        break;
      }
    }

    if (found == nullptr) {
      if (ignore_unknown) {
        continue;
      }
      OPENSSL_PUT_ERROR(SSL, SSL_R_UNEXPECTED_EXTENSION);
      ERR_add_error_dataf("extension %u", unsigned{type});
      *out_alert = SSL_AD_UNSUPPORTED_EXTENSION;
      return false;
    }

    // Duplicate ext_types are forbidden.
    if (found->present) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_DUPLICATE_EXTENSION);
      *out_alert = SSL_AD_ILLEGAL_PARAMETER;
      return false;
    }

    found->present = true;
    found->data = data;
  }

  return true;
}